

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

char * __thiscall testing::internal::FilePath::FindLastPathSeparator(FilePath *this)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char *last_sep;
  FilePath *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = c_str(this);
  pcVar2 = strrchr(pcVar2,0x2f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pcVar2;
  }
  __stack_chk_fail();
}

Assistant:

const char* FilePath::FindLastPathSeparator() const {
  const char* const last_sep = strrchr(c_str(), kPathSeparator);
#if GTEST_HAS_ALT_PATH_SEP_
  const char* const last_alt_sep = strrchr(c_str(), kAlternatePathSeparator);
  // Comparing two pointers of which only one is NULL is undefined.
  if (last_alt_sep != NULL &&
      (last_sep == NULL || last_alt_sep > last_sep)) {
    return last_alt_sep;
  }
#endif
  return last_sep;
}